

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_math.h
# Opt level: O2

void grasshopper_append128(grasshopper_w128_t *x,grasshopper_w128_t *y)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    x->q[lVar1] = x->q[lVar1] ^ y->q[lVar1];
  }
  return;
}

Assistant:

static GRASSHOPPER_INLINE void grasshopper_append128(grasshopper_w128_t* x, const grasshopper_w128_t* y) {
		int i;
#ifdef STRICT_ALIGNMENT
    for (i = 0; i < 16; i++) {
        GRASSHOPPER_ACCESS_128_VALUE_8(*x, i) ^= GRASSHOPPER_ACCESS_128_VALUE_8(*y, i);
    }
#else
    for (i = 0; i < GRASSHOPPER_BIT_PARTS; i++) {
        GRASSHOPPER_ACCESS_128_VALUE(*x, i) ^= GRASSHOPPER_ACCESS_128_VALUE(*y, i);
    }
#endif
}